

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  FILE *__stream;
  int *piVar2;
  undefined8 *in_RSI;
  int i;
  FILE *f;
  char *path;
  int nobj;
  obj obj [256];
  state s;
  int local_f0f4;
  int *in_stack_ffffffffffff0f10;
  rnndb *db;
  uint in_stack_ffffffffffff0f20;
  int iVar3;
  char **in_stack_ffffffffffff0f28;
  undefined4 in_stack_ffffffffffff0f30;
  int in_stack_ffffffffffff0f34;
  state *in_stack_ffffffffffff0f38;
  state *in_stack_ffffffffffff0f40;
  char *in_stack_ffffffffffff0f48;
  undefined7 in_stack_ffffffffffff0f50;
  undefined1 in_stack_ffffffffffff0f57;
  FILE *in_stack_ffffffffffff0f58;
  state *in_stack_ffffffffffff0f60;
  uint32_t in_stack_ffffffffffff0f78;
  uint32_t in_stack_ffffffffffff0f7c;
  state *in_stack_ffffffffffff0f80;
  code *local_d8d8 [5];
  rnndb *local_d8b0;
  rnndomain *local_d8a8;
  void *local_1880;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  memset(local_d8d8,0,0xd8c8);
  iVar3 = 0;
  db = (rnndb *)0x0;
  _Var1 = configure(in_stack_ffffffffffff0f38,in_stack_ffffffffffff0f34,in_stack_ffffffffffff0f28,
                    (char **)(ulong)in_stack_ffffffffffff0f20,(obj *)0x0,in_stack_ffffffffffff0f10);
  if (_Var1) {
    __stream = fopen((char *)db,"r");
    if (__stream == (FILE *)0x0) {
      perror((char *)*local_10);
      piVar2 = __errno_location();
      local_4 = *piVar2;
    }
    else {
      rnn_init();
      local_d8b0 = rnn_newdb();
      rnn_parsefile((rnndb *)CONCAT44(in_stack_ffffffffffff0f34,in_stack_ffffffffffff0f30),
                    (char *)in_stack_ffffffffffff0f28);
      rnn_prepdb((rnndb *)__stream);
      local_d8a8 = rnn_finddomain(db,(char *)__stream);
      for (local_f0f4 = 0; local_f0f4 < iVar3; local_f0f4 = local_f0f4 + 1) {
        add_object(in_stack_ffffffffffff0f80,in_stack_ffffffffffff0f7c,in_stack_ffffffffffff0f78);
      }
      if (local_d8d8[0] == parse_renouveau) {
        dirname((char *)db);
        parse_renouveau_chipset(in_stack_ffffffffffff0f40,(char *)in_stack_ffffffffffff0f38);
        parse_renouveau_objects
                  ((state *)CONCAT17(in_stack_ffffffffffff0f57,in_stack_ffffffffffff0f50),
                   in_stack_ffffffffffff0f48);
        parse_renouveau_startup
                  ((state *)CONCAT44(in_stack_ffffffffffff0f34,in_stack_ffffffffffff0f30),
                   (char *)in_stack_ffffffffffff0f28);
      }
      dedma(in_stack_ffffffffffff0f60,in_stack_ffffffffffff0f58,(_Bool)in_stack_ffffffffffff0f57);
      fclose(__stream);
      free(local_1880);
      local_4 = 0;
    }
  }
  else {
    local_4 = 0x16;
  }
  return local_4;
}

Assistant:

int
main(int argc, char *argv[])
{
	struct state s = { };
	struct obj obj[MAX_OBJECTS];
	int nobj = 0;
	char *path = NULL;
	FILE *f;
	int i;

	/* parse the command line */
	if (!configure(&s, argc, argv, &path, obj, &nobj))
		return EINVAL;

	/* open the input */
	f = fopen(path, "r");
	if (!f) {
		perror(argv[0]);
		return errno;
	}

	/* set up an rnn context */
	rnn_init();
	s.db = rnn_newdb();
	rnn_parsefile(s.db, "nv_objects.xml");
	rnn_prepdb(s.db);
	s.dom = rnn_finddomain(s.db, "NV01_SUBCHAN");

	/* insert objects specified in the command line */
	for (i = 0; i < nobj; i++)
		add_object(&s, obj[i].handle, obj[i].class);

	if (s.op.parse == parse_renouveau) {
		path = dirname(path);
		parse_renouveau_chipset(&s, path);
		parse_renouveau_objects(&s, path);
		parse_renouveau_startup(&s, path);
	}

	/* do it */
	dedma(&s, f, false);

	/* clean up */
	fclose(f);
	free(s.parse.buf);

	return 0;
}